

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

bool __thiscall
brotli::HashLongestMatch<15,_6,_10>::FindLongestMatch
          (HashLongestMatch<15,_6,_10> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  int *s1;
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong local_88;
  
  *best_len_code_out = 0;
  sVar7 = *best_len_out;
  *best_len_out = 0;
  uVar14 = cur_ix & ring_buffer_mask;
  dVar19 = *best_score_out;
  s1 = (int *)(data + uVar14);
  pdVar11 = (double *)
            &BackwardReferenceScoreUsingLastDistance(unsigned_long,unsigned_long)::
             kDistanceShortCodeBitCost;
  lVar10 = 0;
  bVar8 = false;
  for (uVar16 = 0; uVar16 != 10; uVar16 = uVar16 + 1) {
    uVar17 = (long)*(int *)((long)&kDistanceCacheOffset + lVar10) +
             (long)distance_cache[*(uint *)((long)&kDistanceCacheIndex + lVar10)];
    if ((uVar17 <= max_backward && cur_ix - uVar17 < cur_ix) && (sVar7 + uVar14 <= ring_buffer_mask)
       ) {
      uVar12 = cur_ix - uVar17 & ring_buffer_mask;
      uVar15 = uVar12 + sVar7;
      if ((((uVar15 <= ring_buffer_mask) && (data[sVar7 + uVar14] == data[uVar15])) &&
          ((sVar6 = FindMatchLengthWithLimit(data + uVar12,(uint8_t *)s1,max_length), 2 < sVar6 ||
           ((uVar16 < 2 && (sVar6 == 2)))))) &&
         (auVar20._8_4_ = (int)(sVar6 >> 0x20), auVar20._0_8_ = sVar6, auVar20._12_4_ = 0x45300000,
         dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * 5.4 - *pdVar11,
         dVar19 < dVar18)) {
        *best_len_out = sVar6;
        *best_len_code_out = sVar6;
        *best_distance_out = uVar17;
        *best_score_out = dVar18;
        bVar8 = true;
        sVar7 = sVar6;
        dVar19 = dVar18;
      }
    }
    pdVar11 = pdVar11 + 1;
    lVar10 = lVar10 + 4;
  }
  iVar2 = *s1;
  uVar9 = (uint)(iVar2 * 0x1e35a7bd) >> 0x11;
  uVar1 = this->num_[uVar9];
  uVar17 = (ulong)uVar1;
  uVar16 = 0;
  if (0x40 < uVar1) {
    uVar16 = (ulong)(uVar1 - 0x40);
  }
LAB_0016bd21:
  do {
    if (uVar17 <= uVar16) {
LAB_0016be52:
      *(int *)((long)this->buckets_[0] + (ulong)(uVar1 & 0x3f) * 4 + (ulong)(uVar9 << 8)) =
           (int)cur_ix;
      this->num_[uVar9] = uVar1 + 1;
      bVar5 = true;
      if (!bVar8) {
        uVar14 = this->num_dict_lookups_;
        local_88 = this->num_dict_matches_;
        if (local_88 < uVar14 >> 7) {
          bVar5 = false;
        }
        else {
          bVar5 = bVar8;
          for (lVar10 = 0; (int)lVar10 != 2; lVar10 = lVar10 + 1) {
            this->num_dict_lookups_ = uVar14 + 1 + lVar10;
            uVar1 = *(ushort *)
                     (kStaticDictionaryHash +
                     lVar10 * 2 + (ulong)((uint)(iVar2 * 0x1e35a7bd) >> 0x10 & 0xfffc));
            if ((uVar1 != 0) && (uVar16 = (ulong)(uVar1 & 0x1f), uVar16 <= max_length)) {
              sVar7 = FindMatchLengthWithLimit
                                ((uint8_t *)s1,
                                 kBrotliDictionary +
                                 uVar16 * (uVar1 >> 5) +
                                 (ulong)kBrotliDictionaryOffsetsByLength[uVar16],uVar16);
              if (sVar7 != 0 && uVar16 < sVar7 + 10) {
                sVar6 = (ulong)(uVar1 >> 5) + max_backward + 1 +
                        (long)(1 << (""[uVar16] & 0x1f)) *
                        (ulong)(byte)kCutoffTransforms[uVar16 - sVar7];
                auVar22._8_4_ = (int)(sVar7 >> 0x20);
                auVar22._0_8_ = sVar7;
                auVar22._12_4_ = 0x45300000;
                iVar4 = 0x1f;
                uVar9 = (uint)sVar6;
                if (uVar9 != 0) {
                  for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                  }
                }
                dVar18 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) * 5.4 +
                         (double)iVar4 * -1.2;
                if (dVar19 < dVar18) {
                  local_88 = local_88 + 1;
                  this->num_dict_matches_ = local_88;
                  *best_len_out = sVar7;
                  *best_len_code_out = uVar16;
                  *best_distance_out = sVar6;
                  *best_score_out = dVar18;
                  bVar5 = true;
                  dVar19 = dVar18;
                }
              }
            }
          }
        }
      }
      return bVar5;
    }
    uVar3 = *(uint *)((long)this->buckets_[0] +
                     (ulong)((int)uVar17 - 1U & 0x3f) * 4 + (ulong)(uVar9 << 8));
    uVar15 = cur_ix - uVar3;
    if ((uVar15 == 0) || (max_backward < uVar15)) goto LAB_0016be52;
    if (sVar7 + uVar14 <= ring_buffer_mask) {
      uVar13 = (ulong)(uVar3 & (uint)ring_buffer_mask);
      uVar12 = uVar13 + sVar7;
      if (((uVar12 <= ring_buffer_mask) && (data[sVar7 + uVar14] == data[uVar12])) &&
         (sVar6 = FindMatchLengthWithLimit(data + uVar13,(uint8_t *)s1,max_length), 3 < sVar6)) {
        auVar21._8_4_ = (int)(sVar6 >> 0x20);
        auVar21._0_8_ = sVar6;
        auVar21._12_4_ = 0x45300000;
        iVar4 = 0x1f;
        if ((uint)uVar15 != 0) {
          for (; (uint)uVar15 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        dVar18 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * 5.4 +
                 (double)iVar4 * -1.2;
        if (dVar19 < dVar18) break;
      }
    }
    uVar17 = uVar17 - 1;
  } while( true );
  *best_len_out = sVar6;
  *best_len_code_out = sVar6;
  *best_distance_out = uVar15;
  *best_score_out = dVar18;
  uVar17 = uVar17 - 1;
  bVar8 = true;
  sVar7 = sVar6;
  dVar19 = dVar18;
  goto LAB_0016bd21;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }